

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O0

int __thiscall LPCMStreamReader::convertWavToPCM(LPCMStreamReader *this,uint8_t *start,uint8_t *end)

{
  uint8_t uVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  uint8_t *end_00;
  ulong uVar5;
  uint8_t *puVar6;
  int iVar7;
  uint local_bc;
  uint local_9c;
  int bits_per_sample;
  int sampling_index;
  int channelsIndex;
  int audio_data_payload_size;
  uint8_t *src;
  uint8_t *dst;
  uint8_t *lfeData;
  uint8_t *tmpData_1;
  uint8_t *tmpData;
  uint8_t *puStack_50;
  uint8_t tmp;
  uint8_t *curPos_1;
  uint16_t *curPos;
  int64_t ch1FullSize;
  int64_t cLen;
  int fullSampleSize;
  int ch1SampleSize;
  uint8_t *end_local;
  uint8_t *start_local;
  LPCMStreamReader *this_local;
  
  if (this->m_bitsPerSample == 0x14) {
    local_9c = 3;
  }
  else {
    local_9c = this->m_bitsPerSample / 8;
  }
  iVar4 = this->m_channels * local_9c;
  if ((long)end - (long)start < (long)iVar4) {
    this_local._4_4_ = 0;
  }
  else {
    end_00 = start + (((long)end - (long)start) - ((long)end - (long)start) % (long)iVar4);
    uVar5 = ((long)end_00 - (long)start) / (long)(ulong)this->m_channels;
    curPos_1 = start;
    if (this->m_bitsPerSample == 0x10) {
      for (; curPos_1 < end_00; curPos_1 = curPos_1 + 2) {
        uVar3 = my_ntohs(*(uint16_t *)curPos_1);
        *(uint16_t *)curPos_1 = uVar3;
      }
    }
    else {
      puStack_50 = start;
      if (0x10 < this->m_bitsPerSample) {
        for (; puStack_50 < end_00 + -2; puStack_50 = puStack_50 + 3) {
          uVar1 = *puStack_50;
          *puStack_50 = puStack_50[2];
          puStack_50[2] = uVar1;
        }
      }
    }
    if (this->m_channels == '\x06') {
      puVar6 = (uint8_t *)operator_new__(uVar5);
      storeChannelData(this,start,end_00,4,puVar6,(uint)this->m_channels);
      copyChannelData(this,start,end_00,5,4,(uint)this->m_channels);
      copyChannelData(this,start,end_00,6,5,(uint)this->m_channels);
      restoreChannelData(this,start,end_00,6,puVar6,(uint)this->m_channels);
      if (puVar6 != (uint8_t *)0x0) {
        operator_delete__(puVar6);
      }
    }
    else if (this->m_channels == '\a') {
      puVar6 = (uint8_t *)operator_new__(uVar5);
      storeChannelData(this,start,end_00,4,puVar6,(uint)this->m_channels);
      copyChannelData(this,start,end_00,6,4,(uint)this->m_channels);
      copyChannelData(this,start,end_00,5,6,(uint)this->m_channels);
      restoreChannelData(this,start,end_00,5,puVar6,(uint)this->m_channels);
      if (puVar6 != (uint8_t *)0x0) {
        operator_delete__(puVar6);
      }
    }
    else if (this->m_channels == '\b') {
      puVar6 = (uint8_t *)operator_new__(uVar5);
      storeChannelData(this,start,end_00,4,puVar6,(uint)this->m_channels);
      copyChannelData(this,start,end_00,7,4,(uint)this->m_channels);
      copyChannelData(this,start,end_00,8,7,(uint)this->m_channels);
      restoreChannelData(this,start,end_00,8,puVar6,(uint)this->m_channels);
      if (puVar6 != (uint8_t *)0x0) {
        operator_delete__(puVar6);
      }
    }
    iVar7 = 0;
    if ((this->m_needPCMHdr & 1U) != 0) {
      iVar7 = 4;
    }
    src = this->m_tmpFrameBuffer + iVar7;
    for (_channelsIndex = start; _channelsIndex < end_00; _channelsIndex = _channelsIndex + iVar4) {
      memcpy(src,_channelsIndex,(long)iVar4);
      src = src + iVar4;
      if ((uint)this->m_channels % 2 == 1) {
        memset(src,0,(long)(int)local_9c);
        src = src + (int)local_9c;
      }
    }
    if (&this->field_0x4463 <= src) {
      __assert_fail("dst < m_tmpFrameBuffer + sizeof(m_tmpFrameBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jcdr428[P]tsMuxer/tsMuxer/lpcmStreamReader.cpp"
                    ,0xf7,"int LPCMStreamReader::convertWavToPCM(uint8_t *, uint8_t *)");
    }
    if ((this->m_needPCMHdr & 1U) != 0) {
      if (this->m_bitsPerSample == 0x14) {
        local_bc = 0x18;
      }
      else {
        local_bc = (uint)this->m_bitsPerSample;
      }
      iVar4 = local_bc * this->m_freq * (*(int *)&this->m_channels + 1U & 0xfe);
      if (iVar4 < 0) {
        iVar4 = iVar4 + 7;
      }
      iVar4 = (iVar4 >> 3) / 200;
      sampling_index._1_1_ = (uint8_t)((uint)iVar4 >> 8);
      this->m_tmpFrameBuffer[0] = sampling_index._1_1_;
      sampling_index._0_1_ = (uint8_t)iVar4;
      this->m_tmpFrameBuffer[1] = (uint8_t)sampling_index;
      bits_per_sample = 1;
      switch(this->m_channels) {
      case '\x02':
        bits_per_sample = 3;
        break;
      case '\x03':
        bits_per_sample = ((this->m_lfeExists & 1U) != 0) + 4;
        break;
      case '\x04':
        bits_per_sample = ((this->m_lfeExists & 1U) == 0) + 6;
        break;
      case '\x05':
        bits_per_sample = 8;
        break;
      case '\x06':
        bits_per_sample = 9;
        break;
      case '\a':
        bits_per_sample = 10;
        break;
      case '\b':
        bits_per_sample = 0xb;
      }
      bVar2 = 1;
      if (this->m_freq == 96000) {
        bVar2 = 4;
      }
      else if (this->m_freq == 0x2ee00) {
        bVar2 = 5;
      }
      this->m_tmpFrameBuffer[2] = (byte)(bits_per_sample << 4) | bVar2;
      this->m_tmpFrameBuffer[3] =
           (byte)((int)(this->m_bitsPerSample - 0xc) / 4 << 6) | (this->m_firstFrame & 1U) << 5;
    }
    this_local._4_4_ = (int)src - ((int)this + 0xdf);
  }
  return this_local._4_4_;
}

Assistant:

int LPCMStreamReader::convertWavToPCM(uint8_t* start, uint8_t* end)
{
    // int mch = m_channels; // + (m_channels%2==1 ? 1 : 0);
    const int ch1SampleSize = (m_bitsPerSample == 20 ? 3 : m_bitsPerSample / 8);
    const int fullSampleSize = m_channels * ch1SampleSize;
    if (end - start < fullSampleSize)
        return 0;
    int64_t cLen = end - start;
    cLen -= cLen % fullSampleSize;
    end = start + cLen;

    const int64_t ch1FullSize = (end - start) / m_channels;
    // 1. convert byte order to little endian
    if (m_bitsPerSample == 16)
    {
        for (auto curPos = reinterpret_cast<uint16_t*>(start); curPos < reinterpret_cast<uint16_t*>(end); ++curPos)
            *curPos = my_htons(*curPos);
    }
    else if (m_bitsPerSample > 16)
    {
        for (uint8_t* curPos = start; curPos < end - 2; curPos += 3)
        {
            const uint8_t tmp = curPos[0];
            curPos[0] = curPos[2];
            curPos[2] = tmp;
        }
    }
    // 2. Remap channels to Blu-ray standard
    if (m_channels == 6)
    {
        const auto tmpData = new uint8_t[ch1FullSize];
        storeChannelData(start, end, 4, tmpData, m_channels);    // copy channel 6(LFE) to tmpData
        copyChannelData(start, end, 5, 4, m_channels);           // Shift RS
        copyChannelData(start, end, 6, 5, m_channels);           // Shift LS
        restoreChannelData(start, end, 6, tmpData, m_channels);  // copy LFE to channel #4
        delete[] tmpData;
    }
    else if (m_channels == 7)
    {
        const auto tmpData = new uint8_t[ch1FullSize];

        storeChannelData(start, end, 4, tmpData, m_channels);  // copy channel 8(LFE) to tmpData
        copyChannelData(start, end, 6, 4, m_channels);
        copyChannelData(start, end, 5, 6, m_channels);
        restoreChannelData(start, end, 5, tmpData, m_channels);

        delete[] tmpData;
    }
    else if (m_channels == 8)
    {
        const auto lfeData = new uint8_t[ch1FullSize];

        storeChannelData(start, end, 4, lfeData, m_channels);  // copy channel 8(LFE) to tmpData
        copyChannelData(start, end, 7, 4, m_channels);
        copyChannelData(start, end, 8, 7, m_channels);
        restoreChannelData(start, end, 8, lfeData, m_channels);

        delete[] lfeData;
    }
    // 3. transfer to frame buffer and Add X channel (zero channel for padding if needed)
    uint8_t* dst = m_tmpFrameBuffer + (m_needPCMHdr ? 4 : 0);
    const uint8_t* src = start;
    for (; src < end; src += fullSampleSize)
    {
        memcpy(dst, src, fullSampleSize);
        dst += fullSampleSize;
        if (m_channels % 2 == 1)
        {
            memset(dst, 0, ch1SampleSize);
            dst += ch1SampleSize;
        }
    }
    assert(dst < m_tmpFrameBuffer + sizeof(m_tmpFrameBuffer));
    // 4. add LPCM frame header
    if (m_needPCMHdr)
    {
        const int audio_data_payload_size = (m_bitsPerSample == 20 ? 24 : m_bitsPerSample) * m_freq *
                                            ((m_channels + 1) & 0xfe) / 8 / 200;  // 5 ms frame len. 1000/5 = 200
        // int audio_data_payload_size = dst - (m_tmpFrameBuffer + 4);
        m_tmpFrameBuffer[0] = static_cast<uint8_t>(audio_data_payload_size >> 8);
        m_tmpFrameBuffer[1] = audio_data_payload_size & 0xff;
        int channelsIndex = 1;
        switch (m_channels)
        {
        case 2:
            channelsIndex = 3;
            break;
        case 3:
            channelsIndex = 4 + (m_lfeExists ? 1 : 0);
            break;
        case 4:
            channelsIndex = 6 + (m_lfeExists ? 0 : 1);
            break;
        case 5:
            channelsIndex = 8;
            break;
        case 6:
            channelsIndex = 9;
            break;
        case 7:
            channelsIndex = 10;
            break;
        case 8:
            channelsIndex = 11;
            break;
        default:;
        }
        int sampling_index = 1;
        if (m_freq == 96000)
            sampling_index = 4;
        else if (m_freq == 192000)
            sampling_index = 5;
        m_tmpFrameBuffer[2] = (channelsIndex << 4 | sampling_index) & 0xff;
        const int bits_per_sample = (m_bitsPerSample - 12) / 4;
        m_tmpFrameBuffer[3] = (bits_per_sample << 6 | m_firstFrame << 5) & 0xff;
    }
    return static_cast<int>(dst - m_tmpFrameBuffer);
}